

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O3

int redisFormatCommandArgv(char **target,int argc,char **argv,size_t *argvlen)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *__s;
  int iVar6;
  ulong uVar7;
  
  iVar3 = -1;
  if (target != (char **)0x0) {
    uVar2 = (ulong)(uint)argc;
    iVar6 = 1;
    if (9 < (uint)argc) {
      uVar7 = (long)argc;
      iVar4 = 4;
      do {
        iVar6 = iVar4;
        if (uVar7 < 100) {
          iVar6 = iVar6 + -2;
          goto LAB_00105ab5;
        }
        if (uVar7 < 1000) {
          iVar6 = iVar6 + -1;
          goto LAB_00105ab5;
        }
        if (uVar7 < 10000) goto LAB_00105ab5;
        bVar1 = 99999 < uVar7;
        uVar7 = uVar7 / 10000;
        iVar4 = iVar6 + 4;
      } while (bVar1);
      iVar6 = iVar6 + 1;
    }
LAB_00105ab5:
    iVar6 = iVar6 + 3;
    if (0 < argc) {
      uVar7 = 0;
      do {
        if (argvlen == (size_t *)0x0) {
          sVar5 = strlen(argv[uVar7]);
        }
        else {
          sVar5 = argvlen[uVar7];
        }
        sVar5 = bulklen(sVar5);
        iVar6 = iVar6 + (int)sVar5;
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
    }
    __s = (char *)malloc((long)(iVar6 + 1));
    if (__s != (char *)0x0) {
      iVar3 = sprintf(__s,"*%d\r\n",uVar2);
      if (0 < argc) {
        uVar7 = 0;
        do {
          if (argvlen == (size_t *)0x0) {
            sVar5 = strlen(argv[uVar7]);
          }
          else {
            sVar5 = argvlen[uVar7];
          }
          iVar4 = sprintf(__s + iVar3,"$%zu\r\n",sVar5);
          iVar3 = iVar3 + iVar4;
          memcpy(__s + iVar3,argv[uVar7],sVar5);
          (__s + (iVar3 + (int)sVar5))[0] = '\r';
          (__s + (iVar3 + (int)sVar5))[1] = '\n';
          iVar3 = iVar3 + (int)sVar5 + 2;
          uVar7 = uVar7 + 1;
        } while (uVar2 != uVar7);
      }
      if (iVar3 != iVar6) {
        __assert_fail("pos == totlen",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/hiredis.c"
                      ,0x276,
                      "int redisFormatCommandArgv(char **, int, const char **, const size_t *)");
      }
      __s[iVar6] = '\0';
      *target = __s;
      iVar3 = iVar6;
    }
  }
  return iVar3;
}

Assistant:

int redisFormatCommandArgv(char **target, int argc, const char **argv, const size_t *argvlen) {
    char *cmd = NULL; /* final command */
    int pos; /* position in final command */
    size_t len;
    int totlen, j;

    /* Abort on a NULL target */
    if (target == NULL)
        return -1;

    /* Calculate number of bytes needed for the command */
    totlen = 1+countDigits(argc)+2;
    for (j = 0; j < argc; j++) {
        len = argvlen ? argvlen[j] : strlen(argv[j]);
        totlen += bulklen(len);
    }

    /* Build the command at protocol level */
    cmd = malloc(totlen+1);
    if (cmd == NULL)
        return -1;

    pos = sprintf(cmd,"*%d\r\n",argc);
    for (j = 0; j < argc; j++) {
        len = argvlen ? argvlen[j] : strlen(argv[j]);
        pos += sprintf(cmd+pos,"$%zu\r\n",len);
        memcpy(cmd+pos,argv[j],len);
        pos += len;
        cmd[pos++] = '\r';
        cmd[pos++] = '\n';
    }
    assert(pos == totlen);
    cmd[pos] = '\0';

    *target = cmd;
    return totlen;
}